

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O3

EC_T_BOOL FindSlaveGetFixedAddr
                    (EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_DWORD dwSlaveInstance,
                    EC_T_DWORD dwVendorId,EC_T_DWORD dwProductCode,EC_T_WORD *pwPhysAddr)

{
  int iVar1;
  uint uVar2;
  short sVar3;
  uint uVar4;
  EC_T_DWORD EVar5;
  EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
  undefined1 local_9c [32];
  EC_T_DWORD local_7c;
  EC_T_DWORD local_78;
  EC_T_WORD local_64;
  
  iVar1 = emGetNumConnectedSlaves();
  if (iVar1 != 0) {
    sVar3 = 0;
    EVar5 = 0;
    uVar4 = 0;
    do {
      uVar2 = emGetBusSlaveInfo(dwInstanceID,0,sVar3,local_9c);
      if (uVar2 == 0) {
        if ((local_7c == dwVendorId) && (local_78 == dwProductCode)) {
          if (EVar5 == dwSlaveInstance) {
            *pwPhysAddr = local_64;
            return 1;
          }
          EVar5 = EVar5 + 1;
        }
      }
      else {
        CAtEmLogging::LogError
                  (poLog,"PrintSlaveInfos() emGetBusSlaveInfo return with error 0x%x",(ulong)uVar2);
      }
      uVar4 = uVar4 + 1;
      uVar2 = emGetNumConnectedSlaves(dwInstanceID);
      sVar3 = sVar3 + -1;
    } while (uVar4 < uVar2);
  }
  return 0;
}

Assistant:

EC_T_BOOL FindSlaveGetFixedAddr
    (EC_T_DWORD     dwInstanceID
    ,CAtEmLogging*  poLog
    ,EC_T_DWORD     dwSlaveInstance     /**< [in]   Slave instance (0 = first matching, 1 = second, ...) */
    ,EC_T_DWORD     dwVendorId          /**< [in]   Vendor Id of slave to search */
    ,EC_T_DWORD     dwProductCode       /**< [in]   Product Code of slave to search */
    ,EC_T_WORD*     pwPhysAddr)         /**< [out]  Physical Address of slave */
{
EC_T_DWORD dwRes              = EC_E_ERROR;
EC_T_DWORD dwSlaveIdx         = 0;
EC_T_DWORD dwSlaveInstanceCnt = 0;

    for (dwSlaveIdx = 0; dwSlaveIdx < emGetNumConnectedSlaves(dwInstanceID); dwSlaveIdx++)
    {
    EC_T_WORD           wAutoIncAddress = (EC_T_WORD)(0-dwSlaveIdx);
    EC_T_BUS_SLAVE_INFO oBusSlaveInfo;

        /* get information about bus slave */
        dwRes = emGetBusSlaveInfo(dwInstanceID, EC_FALSE, wAutoIncAddress, &oBusSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            LogErr("PrintSlaveInfos() emGetBusSlaveInfo return with error 0x%x", dwRes);
            continue;
        }
        if ((oBusSlaveInfo.dwVendorId == dwVendorId) && (oBusSlaveInfo.dwProductCode == dwProductCode))
        {
            if (dwSlaveInstanceCnt == dwSlaveInstance)
            {
                /* slave found */
                *pwPhysAddr = oBusSlaveInfo.wStationAddress;
                return EC_TRUE;
            }
            dwSlaveInstanceCnt++;
        }
    }
    return EC_FALSE;
}